

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O2

FString __thiscall GMESong::GetStats(GMESong *this)

{
  ulong uVar1;
  int iVar2;
  long in_RSI;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)0x71deec;
  if (*(long *)(in_RSI + 0x28) != 0) {
    iVar2 = gme_tell(*(Music_Emu **)(in_RSI + 0x20));
    uVar1 = (long)iVar2 / 1000;
    FString::Format((FString *)this,
                    "Track: \x1cK%d\x1c-  Time:\x1cK%3d:%02d:%03d\x1c-  System: \x1cK%s\x1c-",
                    (ulong)*(uint *)(in_RSI + 0x34),(long)iVar2 / 60000 & 0xffffffff,
                    (long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c &
                    0xffffffff,(long)iVar2 % 1000 & 0xffffffff,
                    *(undefined8 *)(*(long *)(in_RSI + 0x28) + 0x40));
  }
  return (FString)(char *)this;
}

Assistant:

FString GMESong::GetStats()
{
	FString out;

	if (TrackInfo != NULL)
	{
		int time = gme_tell(Emu);
		out.Format(
			"Track: " TEXTCOLOR_YELLOW "%d" TEXTCOLOR_NORMAL
			"  Time:" TEXTCOLOR_YELLOW "%3d:%02d:%03d" TEXTCOLOR_NORMAL
			"  System: " TEXTCOLOR_YELLOW "%s" TEXTCOLOR_NORMAL,
			CurrTrack,
			time/60000,
			(time/1000) % 60,
			time % 1000,
			TrackInfo->system);
	}
	return out;
}